

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUIScrollBar.cpp
# Opt level: O0

void __thiscall irr::gui::CGUIScrollBar::OnPostRender(CGUIScrollBar *this,u32 timeMs)

{
  uint in_ESI;
  long *in_RDI;
  SEvent newEvent;
  s32 oldPos;
  undefined4 local_48 [4];
  undefined8 local_38;
  undefined4 local_30;
  int local_10;
  
  if (((((*(byte *)(in_RDI + 0x2b) & 1) != 0) && ((*(byte *)((long)in_RDI + 0x15a) & 1) == 0)) &&
      ((*(byte *)((long)in_RDI + 0x15b) & 1) != 0)) &&
     (*(int *)((long)in_RDI + 0x17c) + 200U < in_ESI)) {
    *(uint *)((long)in_RDI + 0x17c) = in_ESI;
    local_10 = *(int *)((long)in_RDI + 0x15c);
    if ((int)in_RDI[0x2f] < *(int *)((long)in_RDI + 0x15c) + *(int *)((long)in_RDI + 0x174)) {
      if (*(int *)((long)in_RDI + 0x15c) - *(int *)((long)in_RDI + 0x174) < (int)in_RDI[0x2f]) {
        if ((*(int *)((long)in_RDI + 0x15c) - *(int *)((long)in_RDI + 0x174) <= (int)in_RDI[0x2f])
           && ((int)in_RDI[0x2f] <= *(int *)((long)in_RDI + 0x15c) + *(int *)((long)in_RDI + 0x174))
           ) {
          (**(code **)(*in_RDI + 0x168))(in_RDI,(int)in_RDI[0x2f]);
        }
      }
      else {
        (**(code **)(*in_RDI + 0x168))
                  (in_RDI,*(int *)((long)in_RDI + 0x15c) - *(int *)((long)in_RDI + 0x174));
      }
    }
    else {
      (**(code **)(*in_RDI + 0x168))
                (in_RDI,*(int *)((long)in_RDI + 0x15c) + *(int *)((long)in_RDI + 0x174));
    }
    if ((*(int *)((long)in_RDI + 0x15c) != local_10) && (in_RDI[4] != 0)) {
      local_48[0] = 0;
      local_38 = 0;
      local_30 = 6;
      (**(code **)(*(long *)in_RDI[4] + 0x10))((long *)in_RDI[4],local_48);
    }
  }
  return;
}

Assistant:

void CGUIScrollBar::OnPostRender(u32 timeMs)
{
	if (Dragging && !DraggedBySlider && TrayClick && timeMs > LastChange + 200) {
		LastChange = timeMs;

		const s32 oldPos = Pos;

		if (DesiredPos >= Pos + LargeStep)
			setPos(Pos + LargeStep);
		else if (DesiredPos <= Pos - LargeStep)
			setPos(Pos - LargeStep);
		else if (DesiredPos >= Pos - LargeStep && DesiredPos <= Pos + LargeStep)
			setPos(DesiredPos);

		if (Pos != oldPos && Parent) {
			SEvent newEvent;
			newEvent.EventType = EET_GUI_EVENT;
			newEvent.GUIEvent.Caller = this;
			newEvent.GUIEvent.Element = 0;
			newEvent.GUIEvent.EventType = EGET_SCROLL_BAR_CHANGED;
			Parent->OnEvent(newEvent);
		}
	}
}